

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_truncated_poisson_dist.hpp
# Opt level: O0

void __thiscall
trng::zero_truncated_poisson_dist::param_type::param_type(param_type *this,double mu)

{
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  param_type *in_stack_00000020;
  
  *in_RDI = in_XMM0_Qa;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x391841);
  calc_probabilities(in_stack_00000020);
  return;
}

Assistant:

explicit param_type(double mu) : mu_{mu} { calc_probabilities(); }